

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

void fe_add(fe_loose *h,fe *f,fe *g)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  
  lVar9 = 0;
  do {
    if (0x8cccccccccccc < f->v[lVar9]) {
      __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xbd,"void fe_add(fe_loose *, const fe *, const fe *)");
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  lVar9 = 0;
  do {
    if (0x8cccccccccccc < g->v[lVar9]) {
      __assert_fail("constant_time_declassify_int(g->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xbe,"void fe_add(fe_loose *, const fe *, const fe *)");
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  uVar1 = g->v[1];
  uVar2 = f->v[1];
  uVar3 = g->v[2];
  uVar4 = f->v[2];
  uVar5 = g->v[3];
  uVar6 = f->v[3];
  uVar7 = g->v[4];
  uVar8 = f->v[4];
  h->v[0] = g->v[0] + f->v[0];
  h->v[1] = uVar1 + uVar2;
  h->v[2] = uVar3 + uVar4;
  h->v[3] = uVar5 + uVar6;
  h->v[4] = uVar7 + uVar8;
  lVar9 = 0;
  do {
    if (0x1a666666666664 < h->v[lVar9]) {
      __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x1a666666666664UL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xc0,"void fe_add(fe_loose *, const fe *, const fe *)");
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 5);
  return;
}

Assistant:

static void fe_add(fe_loose *h, const fe *f, const fe *g) {
  assert_fe(f->v);
  assert_fe(g->v);
  fiat_25519_add(h->v, f->v, g->v);
  assert_fe_loose(h->v);
}